

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O0

void __thiscall
Diligent::DearchiverBase::PSOData<Diligent::RayTracingPipelineStateCreateInfo>::AssignShaders
          (PSOData<Diligent::RayTracingPipelineStateCreateInfo> *this)

{
  uint local_24;
  uint local_20;
  Uint32 i_2;
  Uint32 i_1;
  Uint32 i;
  anon_class_8_1_8991fb9c RemapShader;
  PSOData<Diligent::RayTracingPipelineStateCreateInfo> *this_local;
  
  _i_1 = this;
  RemapShader.this = this;
  for (i_2 = 0; i_2 < (this->CreateInfo).GeneralShaderCount; i_2 = i_2 + 1) {
    AssignShaders::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)&i_1,&(this->CreateInfo).pGeneralShaders[i_2].pShader);
  }
  for (local_20 = 0; local_20 < (this->CreateInfo).TriangleHitShaderCount; local_20 = local_20 + 1)
  {
    AssignShaders::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)&i_1,
               &(this->CreateInfo).pTriangleHitShaders[local_20].pClosestHitShader);
    AssignShaders::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)&i_1,
               &(this->CreateInfo).pTriangleHitShaders[local_20].pAnyHitShader);
  }
  for (local_24 = 0; local_24 < (this->CreateInfo).ProceduralHitShaderCount; local_24 = local_24 + 1
      ) {
    AssignShaders::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)&i_1,
               &(this->CreateInfo).pProceduralHitShaders[local_24].pIntersectionShader);
    AssignShaders::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)&i_1,
               &(this->CreateInfo).pProceduralHitShaders[local_24].pClosestHitShader);
    AssignShaders::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)&i_1,
               &(this->CreateInfo).pProceduralHitShaders[local_24].pAnyHitShader);
  }
  return;
}

Assistant:

void DearchiverBase::PSOData<RayTracingPipelineStateCreateInfo>::AssignShaders()
{
    auto RemapShader = [this](IShader* const& inoutShader) //
    {
        size_t ShaderIndex = BitCast<size_t>(inoutShader);
        if (ShaderIndex < Shaders.size())
            const_cast<IShader*&>(inoutShader) = Shaders[ShaderIndex];
        else
        {
            VERIFY(ShaderIndex == ~0u, "Failed to remap shader");
            const_cast<IShader*&>(inoutShader) = nullptr;
        }
    };

    for (Uint32 i = 0; i < CreateInfo.GeneralShaderCount; ++i)
    {
        RemapShader(CreateInfo.pGeneralShaders[i].pShader);
    }
    for (Uint32 i = 0; i < CreateInfo.TriangleHitShaderCount; ++i)
    {
        RemapShader(CreateInfo.pTriangleHitShaders[i].pClosestHitShader);
        RemapShader(CreateInfo.pTriangleHitShaders[i].pAnyHitShader);
    }
    for (Uint32 i = 0; i < CreateInfo.ProceduralHitShaderCount; ++i)
    {
        RemapShader(CreateInfo.pProceduralHitShaders[i].pIntersectionShader);
        RemapShader(CreateInfo.pProceduralHitShaders[i].pClosestHitShader);
        RemapShader(CreateInfo.pProceduralHitShaders[i].pAnyHitShader);
    }
}